

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O2

int Aig_NodeMffcExtendCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vResult)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  Aig_Obj_t *pNode_00;
  uint uVar6;
  int iVar7;
  int iVar8;
  Aig_Obj_t *local_58;
  
  uVar6 = 0;
  for (iVar7 = 0; iVar7 < vLeaves->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(vLeaves,iVar7);
    uVar1 = *(uint *)((long)pvVar5 + 0x1c) & 0xffffff;
    if (uVar6 <= uVar1) {
      uVar6 = uVar1;
    }
  }
  if (uVar6 == 0) {
    iVar7 = 0;
  }
  else {
    local_58 = (Aig_Obj_t *)0x0;
    iVar2 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
    iVar7 = 1000000000;
    for (iVar8 = 0; iVar8 < vLeaves->nSize; iVar8 = iVar8 + 1) {
      pNode_00 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iVar8);
      if ((*(uint *)&pNode_00->field_0x1c & 0xffffff) == uVar6) {
        iVar3 = Aig_NodeDeref_rec(pNode_00,0,(float *)0x0,(float *)0x0);
        if (iVar3 < iVar7) {
          local_58 = pNode_00;
        }
        if (iVar3 <= iVar7) {
          iVar7 = iVar3;
        }
        iVar4 = Aig_NodeRef_rec(pNode_00,0);
        if (iVar3 != iVar4) {
          __assert_fail("ConeCur1 == ConeCur2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                        ,0x123,
                        "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
      }
    }
    if (local_58 == (Aig_Obj_t *)0x0) {
      __assert_fail("pLeafBest != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x125,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    if ((*(uint *)&local_58->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pLeafBest)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x126,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    iVar8 = Aig_NodeDeref_rec(local_58,0,(float *)0x0,(float *)0x0);
    vResult->nSize = 0;
    Aig_ManIncrementTravId(p);
    iVar7 = 1;
    Aig_NodeMffcSupp_rec(p,pNode,0,vResult,1,local_58);
    iVar3 = Aig_NodeRef_rec(local_58,0);
    if (iVar8 != iVar3) {
      __assert_fail("ConeCur1 == ConeCur2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x12f,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    iVar8 = Aig_NodeRef_rec(pNode,0);
    if (iVar2 != iVar8) {
      __assert_fail("ConeSize1 == ConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x132,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
  }
  return iVar7;
}

Assistant:

int Aig_NodeMffcExtendCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vResult )
{
    Aig_Obj_t * pObj, * pLeafBest;
    int i, LevelMax, ConeSize1, ConeSize2, ConeCur1, ConeCur2, ConeBest;
    // dereference the current cut
    LevelMax = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, (int)pObj->Level );
    if ( LevelMax == 0 )
        return 0;
    // dereference the cut
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    // try expanding each node in the boundary
    ConeBest = ABC_INFINITY;
    pLeafBest = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
    {
        if ( (int)pObj->Level != LevelMax )
            continue;
        ConeCur1 = Aig_NodeDeref_rec( pObj, 0, NULL, NULL );
        if ( ConeBest > ConeCur1 )
        {
            ConeBest = ConeCur1;
            pLeafBest = pObj;
        }
        ConeCur2 = Aig_NodeRef_rec( pObj, 0 );
        assert( ConeCur1 == ConeCur2 );
    }
    assert( pLeafBest != NULL );
    assert( Aig_ObjIsNode(pLeafBest) );
    // deref the best leaf
    ConeCur1 = Aig_NodeDeref_rec( pLeafBest, 0, NULL, NULL );
    // collect the cut nodes
    Vec_PtrClear( vResult );
    Aig_ManIncrementTravId( p );
    Aig_NodeMffcSupp_rec( p, pNode, 0, vResult, 1, pLeafBest );
    // ref the nodes
    ConeCur2 = Aig_NodeRef_rec( pLeafBest, 0 );
    assert( ConeCur1 == ConeCur2 );
    // ref the original node
    ConeSize2 = Aig_NodeRef_rec( pNode, 0 );
    assert( ConeSize1 == ConeSize2 );
    return 1;
}